

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NamedTypeSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NamedTypeSyntax_const&>
          (BumpAllocator *this,NamedTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  NameSyntax *pNVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  NamedTypeSyntax *pNVar5;
  
  pNVar5 = (NamedTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedTypeSyntax *)this->endPtr < pNVar5 + 1) {
    pNVar5 = (NamedTypeSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pNVar5 + 1);
  }
  SVar3 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pNVar2 = (args->name).ptr;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  (pNVar5->name).ptr = pNVar2;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar4;
  (pNVar5->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pNVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }